

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cpp
# Opt level: O0

void __thiscall
embree::TutorialBenchmark::registerBenchmark
          (TutorialBenchmark *this,string *name,int argc,char **argv)

{
  ostream *poVar1;
  undefined8 in_RCX;
  undefined4 in_EDX;
  string *in_RSI;
  long in_RDI;
  BenchState benchState;
  undefined1 local_28 [8];
  undefined8 local_20;
  undefined4 local_14;
  string *local_10;
  
  local_20 = in_RCX;
  local_14 = in_EDX;
  local_10 = in_RSI;
  poVar1 = std::operator<<((ostream *)&std::cout,"BENCHMARK SCENE: ");
  poVar1 = std::operator<<(poVar1,local_10);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  (**(code **)(in_RDI + 0xc0))(local_28,in_RDI + 0x90,local_14,local_20);
  return;
}

Assistant:

void TutorialBenchmark::registerBenchmark(std::string const& name, int argc, char** argv)
{
#ifdef USE_GOOGLE_BENCHMARK
  if (params.legacy) {
    std::cout << "BENCHMARK SCENE: " << name << std::endl;
    BenchState benchState;
    func(benchState, params, argc, argv);
  }
  else {
    ::benchmark::RegisterBenchmark(name.c_str(), callBenchFunc, argc, argv, params, func)->Unit(::benchmark::TimeUnit::kMillisecond);
  }
#else
  std::cout << "BENCHMARK SCENE: " << name << std::endl;
  BenchState benchState;
  func(benchState, params, argc, argv);
#endif
}